

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

vector_type * __thiscall
Disa::Vector_Dense<double,_0UL>::operator*=(Vector_Dense<double,_0UL> *this,double *scalar)

{
  bool bVar1;
  reference pdVar2;
  double *element;
  iterator __end0;
  iterator __begin0;
  Vector_Dense<double,_0UL> *__range2;
  double *scalar_local;
  Vector_Dense<double,_0UL> *this_local;
  
  __end0 = std::vector<double,_std::allocator<double>_>::begin
                     (&this->super_vector<double,_std::allocator<double>_>);
  element = (double *)
            std::vector<double,_std::allocator<double>_>::end
                      (&this->super_vector<double,_std::allocator<double>_>);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                      (&__end0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&element);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    *pdVar2 = *scalar * *pdVar2;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  return this;
}

Assistant:

vector_type& operator*=(const _type& scalar) {
    FOR_EACH_REF(element, *this) element *= scalar;
    return *this;
  }